

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct16x16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int in_ECX;
  uint in_EDX;
  __m128i *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  __m128i *palVar23;
  __m128i *palVar24;
  int iVar25;
  int iVar27;
  int iVar28;
  int iVar29;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i in0_11;
  __m128i in0_12;
  __m128i in0_13;
  __m128i in0_14;
  __m128i in0_15;
  __m128i in0_16;
  __m128i in0_17;
  __m128i in0_18;
  __m128i in0_19;
  __m128i in0_20;
  __m128i in0_21;
  __m128i in0_22;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i in1_11;
  __m128i in1_12;
  __m128i in1_13;
  __m128i in1_14;
  __m128i in1_15;
  __m128i in1_16;
  __m128i in1_17;
  __m128i in1_18;
  __m128i in1_19;
  __m128i in1_20;
  __m128i in1_21;
  __m128i in1_22;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  __m128i y;
  __m128i x;
  __m128i v [16];
  __m128i u [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  __m128i cospim48;
  __m128i cospim16;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospi32;
  __m128i cospi8;
  __m128i cospi40;
  __m128i cospim40;
  __m128i cospi24;
  __m128i cospim8;
  __m128i cospi56;
  __m128i cospi4;
  __m128i cospi36;
  __m128i cospi52;
  __m128i cospim52;
  __m128i cospi12;
  __m128i cospim20;
  __m128i cospi20;
  __m128i cospi44;
  __m128i cospim36;
  __m128i cospi28;
  __m128i cospim4;
  __m128i cospi60;
  int32_t *cospi;
  undefined4 in_stack_fffffffffffff3d8;
  int in_stack_fffffffffffff3dc;
  undefined4 in_stack_fffffffffffff3e0;
  int iVar31;
  longlong local_c18;
  longlong lStack_c10;
  longlong local_c08;
  longlong lStack_c00;
  int local_bec;
  undefined1 local_be8 [16];
  undefined1 local_bd8 [16];
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  longlong local_ba8;
  longlong lStack_ba0;
  longlong local_b98;
  longlong lStack_b90;
  longlong local_b88;
  longlong lStack_b80;
  longlong local_b78;
  longlong lStack_b70;
  longlong local_b68;
  longlong lStack_b60;
  longlong local_b58;
  longlong lStack_b50;
  longlong local_b48;
  longlong lStack_b40;
  longlong local_b38;
  longlong lStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  longlong local_ae8;
  longlong lStack_ae0;
  longlong local_ad8;
  longlong lStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  longlong local_aa8;
  longlong lStack_aa0;
  longlong local_a98;
  longlong lStack_a90;
  longlong local_a88;
  longlong lStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  longlong local_a58;
  longlong lStack_a50;
  longlong local_a48;
  longlong lStack_a40;
  longlong local_a38;
  longlong lStack_a30;
  longlong local_a28;
  longlong lStack_a20;
  longlong local_a18;
  longlong lStack_a10;
  longlong local_a08;
  longlong lStack_a00;
  longlong local_9f8;
  longlong lStack_9f0;
  longlong local_9e8;
  longlong lStack_9e0;
  longlong local_9d8;
  longlong lStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  int local_99c;
  int local_998;
  int iStack_994;
  int iStack_990;
  int iStack_98c;
  longlong local_988;
  longlong lStack_980;
  longlong local_978;
  longlong lStack_970;
  longlong local_968;
  longlong lStack_960;
  longlong local_958;
  longlong lStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  longlong local_938;
  longlong lStack_930;
  longlong local_928;
  longlong lStack_920;
  longlong local_918;
  longlong lStack_910;
  longlong local_908;
  longlong lStack_900;
  longlong local_8f8;
  longlong lStack_8f0;
  longlong local_8e8;
  longlong lStack_8e0;
  longlong local_8d8;
  longlong lStack_8d0;
  longlong local_8c8;
  longlong lStack_8c0;
  longlong local_8b8;
  longlong lStack_8b0;
  longlong local_8a8;
  longlong lStack_8a0;
  longlong local_898;
  longlong lStack_890;
  longlong local_888;
  longlong lStack_880;
  longlong local_878;
  longlong lStack_870;
  longlong local_868;
  longlong lStack_860;
  longlong local_858;
  longlong lStack_850;
  longlong local_848;
  longlong lStack_840;
  longlong local_838;
  longlong lStack_830;
  longlong local_828;
  longlong lStack_820;
  int32_t *local_818;
  int local_80c;
  int local_808;
  uint local_804;
  __m128i *local_800;
  undefined8 *local_7f8;
  uint local_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  uint local_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  uint local_7ac;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  uint local_78c;
  undefined8 local_788;
  undefined8 uStack_780;
  uint local_76c;
  undefined8 local_768;
  undefined8 uStack_760;
  uint local_74c;
  undefined8 local_748;
  undefined8 uStack_740;
  uint local_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  uint local_70c;
  undefined8 local_708;
  undefined8 uStack_700;
  int local_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  int local_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  undefined8 local_648;
  undefined8 uStack_640;
  int local_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  int local_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  int local_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int32_t local_4dc;
  int32_t local_4d8;
  int32_t local_4d4;
  int32_t local_4d0;
  int32_t local_4cc;
  int local_4c8;
  int32_t local_4c4;
  int local_4c0;
  int32_t local_4bc;
  int32_t local_4b8;
  int32_t local_4b4;
  int32_t local_4b0;
  int local_4ac;
  int32_t local_4a8;
  int local_4a4;
  int32_t local_4a0;
  int32_t local_49c;
  int local_498;
  int32_t local_494;
  int local_490;
  int32_t local_48c;
  undefined8 local_488;
  undefined8 uStack_480;
  longlong local_478;
  longlong lStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  longlong local_458;
  longlong lStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  longlong local_438;
  longlong lStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  longlong local_418;
  longlong lStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  longlong local_3f8;
  longlong lStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  longlong local_388;
  longlong lStack_380;
  int32_t local_378;
  int32_t local_374;
  int32_t local_370;
  int32_t local_36c;
  longlong local_368;
  longlong lStack_360;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  longlong local_348;
  longlong lStack_340;
  int32_t local_338;
  int32_t local_334;
  int32_t local_330;
  int32_t local_32c;
  longlong local_328;
  longlong lStack_320;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  longlong local_308;
  longlong lStack_300;
  int32_t local_2f8;
  int32_t local_2f4;
  int32_t local_2f0;
  int32_t local_2ec;
  longlong local_2e8;
  longlong lStack_2e0;
  int32_t local_2d8;
  int32_t local_2d4;
  int32_t local_2d0;
  int32_t local_2cc;
  longlong local_2c8;
  longlong lStack_2c0;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  longlong local_2a8;
  longlong lStack_2a0;
  int32_t local_298;
  int32_t local_294;
  int32_t local_290;
  int32_t local_28c;
  longlong local_288;
  longlong lStack_280;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  longlong local_268;
  longlong lStack_260;
  int32_t local_258;
  int32_t local_254;
  int32_t local_250;
  int32_t local_24c;
  longlong local_248;
  longlong lStack_240;
  int32_t local_238;
  int32_t local_234;
  int32_t local_230;
  int32_t local_22c;
  longlong local_228;
  longlong lStack_220;
  int32_t local_218;
  int32_t local_214;
  int32_t local_210;
  int32_t local_20c;
  longlong local_208;
  longlong lStack_200;
  int32_t local_1f8;
  int32_t local_1f4;
  int32_t local_1f0;
  int32_t local_1ec;
  longlong local_1e8;
  longlong lStack_1e0;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  longlong local_1c8;
  longlong lStack_1c0;
  int32_t local_1b8;
  int32_t local_1b4;
  int32_t local_1b0;
  int32_t local_1ac;
  longlong local_1a8;
  longlong lStack_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  longlong local_188;
  longlong lStack_180;
  int32_t local_178;
  int32_t local_174;
  int32_t local_170;
  int32_t local_16c;
  longlong local_168;
  longlong lStack_160;
  int32_t local_158;
  int32_t local_154;
  int32_t local_150;
  int32_t local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  int32_t local_138;
  int32_t local_134;
  int32_t local_130;
  int32_t local_12c;
  longlong local_128;
  longlong lStack_120;
  int32_t local_118;
  int32_t local_114;
  int32_t local_110;
  int32_t local_10c;
  longlong local_108;
  longlong lStack_100;
  int32_t local_f8;
  int32_t local_f4;
  int32_t local_f0;
  int32_t local_ec;
  longlong local_e8;
  longlong lStack_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  longlong local_c8;
  longlong lStack_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  longlong local_28;
  longlong lStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_80c = in_R8D;
  local_808 = in_ECX;
  local_804 = in_EDX;
  local_800 = in_RSI;
  local_7f8 = in_RDI;
  local_818 = cospi_arr(in_EDX);
  local_48c = local_818[0x3c];
  local_828 = CONCAT44(local_48c,local_48c);
  lStack_820 = CONCAT44(local_48c,local_48c);
  local_490 = -local_818[4];
  local_838 = CONCAT44(local_490,local_490);
  lStack_830 = CONCAT44(local_490,local_490);
  local_494 = local_818[0x1c];
  local_848 = CONCAT44(local_494,local_494);
  lStack_840 = CONCAT44(local_494,local_494);
  local_498 = -local_818[0x24];
  local_858 = CONCAT44(local_498,local_498);
  lStack_850 = CONCAT44(local_498,local_498);
  local_49c = local_818[0x2c];
  local_868 = CONCAT44(local_49c,local_49c);
  lStack_860 = CONCAT44(local_49c,local_49c);
  local_4a0 = local_818[0x14];
  local_878 = CONCAT44(local_4a0,local_4a0);
  lStack_870 = CONCAT44(local_4a0,local_4a0);
  local_4a4 = -local_818[0x14];
  local_888 = CONCAT44(local_4a4,local_4a4);
  lStack_880 = CONCAT44(local_4a4,local_4a4);
  local_4a8 = local_818[0xc];
  local_898 = CONCAT44(local_4a8,local_4a8);
  lStack_890 = CONCAT44(local_4a8,local_4a8);
  local_4ac = -local_818[0x34];
  local_8a8 = CONCAT44(local_4ac,local_4ac);
  lStack_8a0 = CONCAT44(local_4ac,local_4ac);
  local_4b0 = local_818[0x34];
  local_8b8 = CONCAT44(local_4b0,local_4b0);
  lStack_8b0 = CONCAT44(local_4b0,local_4b0);
  local_4b4 = local_818[0x24];
  local_8c8 = CONCAT44(local_4b4,local_4b4);
  lStack_8c0 = CONCAT44(local_4b4,local_4b4);
  local_4b8 = local_818[4];
  local_8d8 = CONCAT44(local_4b8,local_4b8);
  lStack_8d0 = CONCAT44(local_4b8,local_4b8);
  local_4bc = local_818[0x38];
  local_8e8 = CONCAT44(local_4bc,local_4bc);
  lStack_8e0 = CONCAT44(local_4bc,local_4bc);
  local_4c0 = -local_818[8];
  local_8f8 = CONCAT44(local_4c0,local_4c0);
  lStack_8f0 = CONCAT44(local_4c0,local_4c0);
  local_4c4 = local_818[0x18];
  local_908 = CONCAT44(local_4c4,local_4c4);
  lStack_900 = CONCAT44(local_4c4,local_4c4);
  local_4c8 = -local_818[0x28];
  local_918 = CONCAT44(local_4c8,local_4c8);
  lStack_910 = CONCAT44(local_4c8,local_4c8);
  local_4cc = local_818[0x28];
  local_928 = CONCAT44(local_4cc,local_4cc);
  lStack_920 = CONCAT44(local_4cc,local_4cc);
  local_4d0 = local_818[8];
  local_938 = CONCAT44(local_4d0,local_4d0);
  lStack_930 = CONCAT44(local_4d0,local_4d0);
  local_4d4 = local_818[0x20];
  local_948 = CONCAT44(local_4d4,local_4d4);
  uStack_940 = CONCAT44(local_4d4,local_4d4);
  local_4d8 = local_818[0x30];
  local_958 = CONCAT44(local_4d8,local_4d8);
  lStack_950 = CONCAT44(local_4d8,local_4d8);
  local_4dc = local_818[0x10];
  local_968 = CONCAT44(local_4dc,local_4dc);
  lStack_960 = CONCAT44(local_4dc,local_4dc);
  local_4e0 = -local_818[0x10];
  local_978 = CONCAT44(local_4e0,local_4e0);
  lStack_970 = CONCAT44(local_4e0,local_4e0);
  local_4e4 = -local_818[0x30];
  local_988 = CONCAT44(local_4e4,local_4e4);
  lStack_980 = CONCAT44(local_4e4,local_4e4);
  local_4e8 = 1 << ((char)local_804 - 1U & 0x1f);
  iVar31 = 8;
  if (local_808 != 0) {
    iVar31 = 6;
  }
  if (local_80c + iVar31 < 0x10) {
    iVar31 = 0x10;
  }
  else {
    iVar31 = 8;
    if (local_808 != 0) {
      iVar31 = 6;
    }
    iVar31 = local_80c + iVar31;
  }
  local_99c._0_1_ = (char)iVar31;
  local_4ec = -(1 << ((char)local_99c - 1U & 0x1f));
  local_9b8 = CONCAT44(local_4ec,local_4ec);
  uStack_9b0 = CONCAT44(local_4ec,local_4ec);
  local_4f0 = (1 << ((char)local_99c - 1U & 0x1f)) + -1;
  local_9c8 = CONCAT44(local_4f0,local_4f0);
  uStack_9c0 = CONCAT44(local_4f0,local_4f0);
  local_bc8 = *local_7f8;
  uStack_bc0 = local_7f8[1];
  local_bb8 = local_7f8[0x10];
  uStack_bb0 = local_7f8[0x11];
  local_ba8 = local_7f8[8];
  lStack_ba0 = local_7f8[9];
  local_b98 = local_7f8[0x18];
  lStack_b90 = local_7f8[0x19];
  local_b88 = local_7f8[4];
  lStack_b80 = local_7f8[5];
  local_b78 = local_7f8[0x14];
  lStack_b70 = local_7f8[0x15];
  local_b68 = local_7f8[0xc];
  lStack_b60 = local_7f8[0xd];
  local_b58 = local_7f8[0x1c];
  lStack_b50 = local_7f8[0x1d];
  local_a48 = local_7f8[2];
  lStack_a40 = local_7f8[3];
  local_a38 = local_7f8[0x12];
  lStack_a30 = local_7f8[0x13];
  local_a28 = local_7f8[10];
  lStack_a20 = local_7f8[0xb];
  local_a18 = local_7f8[0x1a];
  lStack_a10 = local_7f8[0x1b];
  local_a08 = local_7f8[6];
  lStack_a00 = local_7f8[7];
  local_9f8 = local_7f8[0x16];
  lStack_9f0 = local_7f8[0x17];
  local_9e8 = local_7f8[0xe];
  lStack_9e0 = local_7f8[0xf];
  local_9d8 = local_7f8[0x1e];
  lStack_9d0 = local_7f8[0x1f];
  local_ac8 = local_bc8;
  uStack_ac0 = uStack_bc0;
  local_ab8 = local_bb8;
  uStack_ab0 = uStack_bb0;
  local_aa8 = local_ba8;
  lStack_aa0 = lStack_ba0;
  local_a98 = local_b98;
  lStack_a90 = lStack_b90;
  local_a88 = local_b88;
  lStack_a80 = lStack_b80;
  local_a78 = local_b78;
  uStack_a70 = lStack_b70;
  local_a68 = local_b68;
  uStack_a60 = lStack_b60;
  local_a58 = local_b58;
  lStack_a50 = lStack_b50;
  local_99c = iVar31;
  local_388 = local_828;
  lStack_380 = lStack_820;
  local_378 = local_48c;
  local_374 = local_48c;
  local_370 = local_48c;
  local_36c = local_48c;
  local_368 = local_838;
  lStack_360 = lStack_830;
  local_358 = local_490;
  local_354 = local_490;
  local_350 = local_490;
  local_34c = local_490;
  local_348 = local_848;
  lStack_340 = lStack_840;
  local_338 = local_494;
  local_334 = local_494;
  local_330 = local_494;
  local_32c = local_494;
  local_328 = local_858;
  lStack_320 = lStack_850;
  local_318 = local_498;
  local_314 = local_498;
  local_310 = local_498;
  local_30c = local_498;
  local_308 = local_868;
  lStack_300 = lStack_860;
  local_2f8 = local_49c;
  local_2f4 = local_49c;
  local_2f0 = local_49c;
  local_2ec = local_49c;
  local_2e8 = local_878;
  lStack_2e0 = lStack_870;
  local_2d8 = local_4a0;
  local_2d4 = local_4a0;
  local_2d0 = local_4a0;
  local_2cc = local_4a0;
  local_2c8 = local_888;
  lStack_2c0 = lStack_880;
  local_2b8 = local_4a4;
  local_2b4 = local_4a4;
  local_2b0 = local_4a4;
  local_2ac = local_4a4;
  local_2a8 = local_898;
  lStack_2a0 = lStack_890;
  local_298 = local_4a8;
  local_294 = local_4a8;
  local_290 = local_4a8;
  local_28c = local_4a8;
  local_288 = local_8a8;
  lStack_280 = lStack_8a0;
  local_278 = local_4ac;
  local_274 = local_4ac;
  local_270 = local_4ac;
  local_26c = local_4ac;
  local_268 = local_8b8;
  lStack_260 = lStack_8b0;
  local_258 = local_4b0;
  local_254 = local_4b0;
  local_250 = local_4b0;
  local_24c = local_4b0;
  local_248 = local_8c8;
  lStack_240 = lStack_8c0;
  local_238 = local_4b4;
  local_234 = local_4b4;
  local_230 = local_4b4;
  local_22c = local_4b4;
  local_228 = local_8d8;
  lStack_220 = lStack_8d0;
  local_218 = local_4b8;
  local_214 = local_4b8;
  local_210 = local_4b8;
  local_20c = local_4b8;
  local_208 = local_8e8;
  lStack_200 = lStack_8e0;
  local_1f8 = local_4bc;
  local_1f4 = local_4bc;
  local_1f0 = local_4bc;
  local_1ec = local_4bc;
  local_1e8 = local_8f8;
  lStack_1e0 = lStack_8f0;
  local_1d8 = local_4c0;
  local_1d4 = local_4c0;
  local_1d0 = local_4c0;
  local_1cc = local_4c0;
  local_1c8 = local_908;
  lStack_1c0 = lStack_900;
  local_1b8 = local_4c4;
  local_1b4 = local_4c4;
  local_1b0 = local_4c4;
  local_1ac = local_4c4;
  local_1a8 = local_918;
  lStack_1a0 = lStack_910;
  local_198 = local_4c8;
  local_194 = local_4c8;
  local_190 = local_4c8;
  local_18c = local_4c8;
  local_188 = local_928;
  lStack_180 = lStack_920;
  local_178 = local_4cc;
  local_174 = local_4cc;
  local_170 = local_4cc;
  local_16c = local_4cc;
  local_168 = local_938;
  lStack_160 = lStack_930;
  local_158 = local_4d0;
  local_154 = local_4d0;
  local_150 = local_4d0;
  local_14c = local_4d0;
  local_148 = local_948;
  uStack_140 = uStack_940;
  local_138 = local_4d4;
  local_134 = local_4d4;
  local_130 = local_4d4;
  local_12c = local_4d4;
  local_128 = local_958;
  lStack_120 = lStack_950;
  local_118 = local_4d8;
  local_114 = local_4d8;
  local_110 = local_4d8;
  local_10c = local_4d8;
  local_108 = local_968;
  lStack_100 = lStack_960;
  local_f8 = local_4dc;
  local_f4 = local_4dc;
  local_f0 = local_4dc;
  local_ec = local_4dc;
  local_e8 = local_978;
  lStack_e0 = lStack_970;
  local_d8 = local_4e0;
  local_d4 = local_4e0;
  local_d0 = local_4e0;
  local_cc = local_4e0;
  local_c8 = local_988;
  lStack_c0 = lStack_980;
  local_b8 = local_4e4;
  local_b4 = local_4e4;
  local_b0 = local_4e4;
  local_ac = local_4e4;
  local_98 = local_4e8;
  local_94 = local_4e8;
  local_90 = local_4e8;
  local_8c = local_4e8;
  local_88 = local_9b8;
  uStack_80 = uStack_9b0;
  local_78 = local_4ec;
  local_74 = local_4ec;
  local_70 = local_4ec;
  local_6c = local_4ec;
  local_68 = local_9c8;
  uStack_60 = uStack_9c0;
  local_58 = local_4f0;
  local_54 = local_4f0;
  local_50 = local_4f0;
  local_4c = local_4f0;
  local_998 = local_4e8;
  iStack_994 = local_4e8;
  local_a8 = local_4e8;
  iStack_a4 = local_4e8;
  iStack_990 = local_4e8;
  iStack_98c = local_4e8;
  iStack_a0 = local_4e8;
  iStack_9c = local_4e8;
  half_btf_sse4_1((__m128i *)&local_828,(__m128i *)&local_a48,(__m128i *)&local_838,
                  (__m128i *)&local_9d8,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_848,(__m128i *)&local_a38,(__m128i *)&local_858,
                  (__m128i *)&local_9e8,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_868,(__m128i *)&local_a28,(__m128i *)&local_888,
                  (__m128i *)&local_9f8,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_898,(__m128i *)&local_a18,(__m128i *)&local_8a8,
                  (__m128i *)&local_a08,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_8b8,(__m128i *)&local_a18,(__m128i *)&local_898,
                  (__m128i *)&local_a08,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_878,(__m128i *)&local_a28,(__m128i *)&local_868,
                  (__m128i *)&local_9f8,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_8c8,(__m128i *)&local_a38,(__m128i *)&local_848,
                  (__m128i *)&local_9e8,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_8d8,(__m128i *)&local_a48,(__m128i *)&local_828,
                  (__m128i *)&local_9d8,(__m128i *)&local_998,local_804);
  local_ac8 = local_bc8;
  uStack_ac0 = uStack_bc0;
  local_ab8 = local_bb8;
  uStack_ab0 = uStack_bb0;
  local_aa8 = local_ba8;
  lStack_aa0 = lStack_ba0;
  local_a98 = local_b98;
  lStack_a90 = lStack_b90;
  half_btf_sse4_1((__m128i *)&local_8e8,(__m128i *)&local_b88,(__m128i *)&local_8f8,
                  (__m128i *)&local_b58,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_908,(__m128i *)&local_b78,(__m128i *)&local_918,
                  (__m128i *)&local_b68,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_928,(__m128i *)&local_b78,(__m128i *)&local_908,
                  (__m128i *)&local_b68,(__m128i *)&local_998,local_804);
  palVar24 = (__m128i *)(ulong)local_804;
  palVar23 = (__m128i *)&local_998;
  half_btf_sse4_1((__m128i *)&local_938,(__m128i *)&local_b88,(__m128i *)&local_8e8,
                  (__m128i *)&local_b58,palVar23,local_804);
  in0[0] = &local_a48;
  in0[1] = &local_a38;
  in1[1] = (longlong)&local_9c8;
  in1[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0,in1,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_00[0] = &local_a18;
  in0_00[1] = &local_a28;
  in1_00[1] = (longlong)&local_9c8;
  in1_00[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_00,in1_00,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_01[0] = &local_a08;
  in0_01[1] = &local_9f8;
  in1_01[1] = (longlong)&local_9c8;
  in1_01[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_01,in1_01,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_02[0] = &local_9d8;
  in0_02[1] = &local_9e8;
  in1_02[1] = (longlong)&local_9c8;
  in1_02[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_02,in1_02,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  local_398 = local_ac8;
  uStack_390 = uStack_ac0;
  local_3a8 = local_948;
  uStack_3a0 = uStack_940;
  auVar14._8_8_ = uStack_ac0;
  auVar14._0_8_ = local_ac8;
  auVar13._8_8_ = uStack_940;
  auVar13._0_8_ = local_948;
  local_bd8 = pmulld(auVar14,auVar13);
  local_3b8 = local_ab8;
  uStack_3b0 = uStack_ab0;
  local_3c8 = local_948;
  uStack_3c0 = uStack_940;
  auVar12._8_8_ = uStack_ab0;
  auVar12._0_8_ = local_ab8;
  auVar11._8_8_ = uStack_940;
  auVar11._0_8_ = local_948;
  local_be8 = pmulld(auVar12,auVar11);
  local_588 = local_bd8._0_8_;
  uVar17 = local_588;
  uStack_580 = local_bd8._8_8_;
  uVar18 = uStack_580;
  local_598 = local_be8._0_8_;
  uVar15 = local_598;
  uStack_590 = local_be8._8_8_;
  uVar16 = uStack_590;
  local_588._0_4_ = local_bd8._0_4_;
  local_588._4_4_ = local_bd8._4_4_;
  uStack_580._0_4_ = local_bd8._8_4_;
  uStack_580._4_4_ = local_bd8._12_4_;
  local_598._0_4_ = local_be8._0_4_;
  local_598._4_4_ = local_be8._4_4_;
  uStack_590._0_4_ = local_be8._8_4_;
  uStack_590._4_4_ = local_be8._12_4_;
  local_bc8 = CONCAT44(local_588._4_4_ + local_598._4_4_,(int)local_588 + (int)local_598);
  uStack_bc0 = CONCAT44(uStack_580._4_4_ + uStack_590._4_4_,(int)uStack_580 + (int)uStack_590);
  local_5a8 = local_bc8;
  uStack_5a0 = uStack_bc0;
  local_5b8 = local_998;
  iStack_5b4 = iStack_994;
  iStack_5b0 = iStack_990;
  iStack_5ac = iStack_98c;
  iVar25 = (int)local_588 + (int)local_598 + local_998;
  iVar27 = local_588._4_4_ + local_598._4_4_ + iStack_994;
  iVar28 = (int)uStack_580 + (int)uStack_590 + iStack_990;
  iVar29 = uStack_580._4_4_ + uStack_590._4_4_ + iStack_98c;
  local_bc8 = CONCAT44(iVar27,iVar25);
  uStack_bc0 = CONCAT44(iVar29,iVar28);
  local_708 = local_bc8;
  uStack_700 = uStack_bc0;
  local_70c = local_804;
  auVar30 = ZEXT416(local_804);
  local_bc8 = CONCAT44(iVar27 >> auVar30,iVar25 >> auVar30);
  uStack_bc0 = CONCAT44(iVar29 >> auVar30,iVar28 >> auVar30);
  local_508 = local_bd8._0_8_;
  uStack_500 = local_bd8._8_8_;
  local_518 = local_be8._0_8_;
  uStack_510 = local_be8._8_8_;
  local_bb8 = CONCAT44(local_588._4_4_ - local_598._4_4_,(int)local_588 - (int)local_598);
  uStack_bb0 = CONCAT44(uStack_580._4_4_ - uStack_590._4_4_,(int)uStack_580 - (int)uStack_590);
  local_5c8 = local_bb8;
  uStack_5c0 = uStack_bb0;
  local_5d8 = local_998;
  iStack_5d4 = iStack_994;
  iStack_5d0 = iStack_990;
  iStack_5cc = iStack_98c;
  iVar25 = ((int)local_588 - (int)local_598) + local_998;
  iVar27 = (local_588._4_4_ - local_598._4_4_) + iStack_994;
  iVar28 = ((int)uStack_580 - (int)uStack_590) + iStack_990;
  iVar29 = (uStack_580._4_4_ - uStack_590._4_4_) + iStack_98c;
  local_bb8 = CONCAT44(iVar27,iVar25);
  uStack_bb0 = CONCAT44(iVar29,iVar28);
  local_728 = local_bb8;
  uStack_720 = uStack_bb0;
  local_72c = local_804;
  auVar30 = ZEXT416(local_804);
  local_bb8 = CONCAT44(iVar27 >> auVar30,iVar25 >> auVar30);
  uStack_bb0 = CONCAT44(iVar29 >> auVar30,iVar28 >> auVar30);
  local_598 = uVar15;
  uStack_590 = uVar16;
  local_588 = uVar17;
  uStack_580 = uVar18;
  half_btf_sse4_1((__m128i *)&local_958,(__m128i *)&local_aa8,(__m128i *)&local_978,
                  (__m128i *)&local_a98,(__m128i *)&local_998,local_804);
  palVar24 = (__m128i *)(ulong)local_804;
  palVar23 = (__m128i *)&local_998;
  half_btf_sse4_1((__m128i *)&local_968,(__m128i *)&local_aa8,(__m128i *)&local_958,
                  (__m128i *)&local_a98,palVar23,local_804);
  in0_03[0] = &local_b88;
  in0_03[1] = &local_b78;
  in1_03[1] = (longlong)&local_9c8;
  in1_03[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_03,in1_03,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_04[0] = &local_b58;
  in0_04[1] = &local_b68;
  in1_04[1] = (longlong)&local_9c8;
  in1_04[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_04,in1_04,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  local_b48 = local_a48;
  lStack_b40 = lStack_a40;
  half_btf_sse4_1((__m128i *)&local_978,(__m128i *)&local_a38,(__m128i *)&local_958,
                  (__m128i *)&local_9e8,(__m128i *)&local_998,local_804);
  half_btf_sse4_1((__m128i *)&local_988,(__m128i *)&local_a28,(__m128i *)&local_978,
                  (__m128i *)&local_9f8,(__m128i *)&local_998,local_804);
  local_b18 = local_a18;
  uStack_b10 = lStack_a10;
  local_b08 = local_a08;
  uStack_b00 = lStack_a00;
  half_btf_sse4_1((__m128i *)&local_978,(__m128i *)&local_a28,(__m128i *)&local_958,
                  (__m128i *)&local_9f8,(__m128i *)&local_998,local_804);
  palVar24 = (__m128i *)(ulong)local_804;
  palVar23 = (__m128i *)&local_998;
  half_btf_sse4_1((__m128i *)&local_958,(__m128i *)&local_a38,(__m128i *)&local_968,
                  (__m128i *)&local_9e8,palVar23,local_804);
  local_ad8 = local_9d8;
  lStack_ad0 = lStack_9d0;
  in0_05[1] = &local_a98;
  in0_05[0] = (longlong)&local_ac8;
  in1_05[1] = (longlong)&local_9c8;
  in1_05[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_05,in1_05,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_06[0] = &local_ab8;
  in0_06[1] = &local_aa8;
  in1_06[1] = (longlong)&local_9c8;
  in1_06[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_06,in1_06,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  local_a88 = local_b88;
  lStack_a80 = lStack_b80;
  local_3d8 = local_b78;
  lStack_3d0 = lStack_b70;
  local_3e8 = local_948;
  uStack_3e0 = uStack_940;
  auVar10._8_8_ = lStack_b70;
  auVar10._0_8_ = local_b78;
  auVar9._8_8_ = uStack_940;
  auVar9._0_8_ = local_948;
  local_bd8 = pmulld(auVar10,auVar9);
  local_3f8 = local_b68;
  lStack_3f0 = lStack_b60;
  local_408 = local_948;
  uStack_400 = uStack_940;
  auVar8._8_8_ = lStack_b60;
  auVar8._0_8_ = local_b68;
  auVar7._8_8_ = uStack_940;
  auVar7._0_8_ = local_948;
  local_be8 = pmulld(auVar8,auVar7);
  local_528 = local_be8._0_8_;
  uVar17 = local_528;
  uStack_520 = local_be8._8_8_;
  uVar18 = uStack_520;
  local_538 = local_bd8._0_8_;
  uVar15 = local_538;
  uStack_530 = local_bd8._8_8_;
  uVar16 = uStack_530;
  local_528._0_4_ = local_be8._0_4_;
  local_528._4_4_ = local_be8._4_4_;
  uStack_520._0_4_ = local_be8._8_4_;
  uStack_520._4_4_ = local_be8._12_4_;
  local_538._0_4_ = local_bd8._0_4_;
  local_538._4_4_ = local_bd8._4_4_;
  uStack_530._0_4_ = local_bd8._8_4_;
  uStack_530._4_4_ = local_bd8._12_4_;
  local_a78 = CONCAT44(local_528._4_4_ - local_538._4_4_,(int)local_528 - (int)local_538);
  uStack_a70 = CONCAT44(uStack_520._4_4_ - uStack_530._4_4_,(int)uStack_520 - (int)uStack_530);
  local_5e8 = local_a78;
  uStack_5e0 = uStack_a70;
  local_5f8 = local_998;
  iStack_5f4 = iStack_994;
  iStack_5f0 = iStack_990;
  iStack_5ec = iStack_98c;
  iVar25 = ((int)local_528 - (int)local_538) + local_998;
  iVar27 = (local_528._4_4_ - local_538._4_4_) + iStack_994;
  iVar28 = ((int)uStack_520 - (int)uStack_530) + iStack_990;
  iVar29 = (uStack_520._4_4_ - uStack_530._4_4_) + iStack_98c;
  local_a78 = CONCAT44(iVar27,iVar25);
  uStack_a70 = CONCAT44(iVar29,iVar28);
  local_748 = local_a78;
  uStack_740 = uStack_a70;
  local_74c = local_804;
  auVar30 = ZEXT416(local_804);
  local_a78 = CONCAT44(iVar27 >> auVar30,iVar25 >> auVar30);
  uStack_a70 = CONCAT44(iVar29 >> auVar30,iVar28 >> auVar30);
  local_608 = local_be8._0_8_;
  uStack_600 = local_be8._8_8_;
  local_618 = local_bd8._0_8_;
  uStack_610 = local_bd8._8_8_;
  local_a68 = CONCAT44(local_528._4_4_ + local_538._4_4_,(int)local_528 + (int)local_538);
  uStack_a60 = CONCAT44(uStack_520._4_4_ + uStack_530._4_4_,(int)uStack_520 + (int)uStack_530);
  local_628 = local_a68;
  uStack_620 = uStack_a60;
  local_638 = local_998;
  iStack_634 = iStack_994;
  iStack_630 = iStack_990;
  iStack_62c = iStack_98c;
  iVar25 = (int)local_528 + (int)local_538 + local_998;
  iVar27 = local_528._4_4_ + local_538._4_4_ + iStack_994;
  iVar28 = (int)uStack_520 + (int)uStack_530 + iStack_990;
  iVar29 = uStack_520._4_4_ + uStack_530._4_4_ + iStack_98c;
  local_a68 = CONCAT44(iVar27,iVar25);
  uStack_a60 = CONCAT44(iVar29,iVar28);
  local_768 = local_a68;
  uStack_760 = uStack_a60;
  local_76c = local_804;
  auVar30 = ZEXT416(local_804);
  local_a68 = CONCAT44(iVar27 >> auVar30,iVar25 >> auVar30);
  uStack_a60 = CONCAT44(iVar29 >> auVar30,iVar28 >> auVar30);
  local_a58 = local_b58;
  lStack_a50 = lStack_b50;
  in0_07[0] = &local_a48;
  in0_07[1] = &local_a18;
  in1_07[1] = (longlong)&local_9c8;
  in1_07[0] = (longlong)&local_9b8;
  local_538 = uVar15;
  uStack_530 = uVar16;
  local_528 = uVar17;
  uStack_520 = uVar18;
  addsub_sse4_1(in0_07,in1_07,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_08[0] = &local_a38;
  in0_08[1] = &local_a28;
  in1_08[1] = (longlong)&local_9c8;
  in1_08[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_08,in1_08,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_09[0] = &local_9d8;
  in0_09[1] = &local_a08;
  in1_09[1] = (longlong)&local_9c8;
  in1_09[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_09,in1_09,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_10[0] = &local_9e8;
  in0_10[1] = &local_9f8;
  in1_10[1] = (longlong)&local_9c8;
  in1_10[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_10,in1_10,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_11[1] = &local_b58;
  in0_11[0] = (longlong)&local_bc8;
  in1_11[1] = (longlong)&local_9c8;
  in1_11[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_11,in1_11,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_12[0] = &local_bb8;
  in0_12[1] = &local_b68;
  in1_12[1] = (longlong)&local_9c8;
  in1_12[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_12,in1_12,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_13[0] = &local_ba8;
  in0_13[1] = &local_b78;
  in1_13[1] = (longlong)&local_9c8;
  in1_13[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_13,in1_13,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_14[0] = &local_b98;
  in0_14[1] = &local_b88;
  in1_14[1] = (longlong)&local_9c8;
  in1_14[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_14,in1_14,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  local_b48 = local_a48;
  lStack_b40 = lStack_a40;
  local_b38 = local_a38;
  lStack_b30 = lStack_a30;
  local_418 = local_a28;
  lStack_410 = lStack_a20;
  local_428 = local_948;
  uStack_420 = uStack_940;
  auVar6._8_8_ = lStack_a20;
  auVar6._0_8_ = local_a28;
  auVar5._8_8_ = uStack_940;
  auVar5._0_8_ = local_948;
  auVar30 = pmulld(auVar6,auVar5);
  local_438 = local_9f8;
  lStack_430 = lStack_9f0;
  local_448 = local_948;
  uStack_440 = uStack_940;
  auVar4._8_8_ = lStack_9f0;
  auVar4._0_8_ = local_9f8;
  auVar3._8_8_ = uStack_940;
  auVar3._0_8_ = local_948;
  auVar26 = pmulld(auVar4,auVar3);
  local_be8._0_8_ = auVar26._0_8_;
  local_be8._8_8_ = auVar26._8_8_;
  local_bd8._0_8_ = auVar30._0_8_;
  local_bd8._8_8_ = auVar30._8_8_;
  local_548 = local_be8._0_8_;
  uVar21 = local_548;
  uStack_540 = local_be8._8_8_;
  uVar22 = uStack_540;
  local_558 = local_bd8._0_8_;
  uVar19 = local_558;
  uStack_550 = local_bd8._8_8_;
  uVar20 = uStack_550;
  local_548._0_4_ = auVar26._0_4_;
  local_548._4_4_ = auVar26._4_4_;
  uStack_540._0_4_ = auVar26._8_4_;
  uStack_540._4_4_ = auVar26._12_4_;
  local_558._0_4_ = auVar30._0_4_;
  local_558._4_4_ = auVar30._4_4_;
  uStack_550._0_4_ = auVar30._8_4_;
  uStack_550._4_4_ = auVar30._12_4_;
  local_b28 = CONCAT44(local_548._4_4_ - local_558._4_4_,(int)local_548 - (int)local_558);
  uStack_b20 = CONCAT44(uStack_540._4_4_ - uStack_550._4_4_,(int)uStack_540 - (int)uStack_550);
  local_648 = local_b28;
  uStack_640 = uStack_b20;
  local_658 = local_998;
  iStack_654 = iStack_994;
  iStack_650 = iStack_990;
  iStack_64c = iStack_98c;
  iVar25 = ((int)local_548 - (int)local_558) + local_998;
  iVar27 = (local_548._4_4_ - local_558._4_4_) + iStack_994;
  iVar28 = ((int)uStack_540 - (int)uStack_550) + iStack_990;
  iVar29 = (uStack_540._4_4_ - uStack_550._4_4_) + iStack_98c;
  local_b28 = CONCAT44(iVar27,iVar25);
  uStack_b20 = CONCAT44(iVar29,iVar28);
  local_788 = local_b28;
  uStack_780 = uStack_b20;
  local_78c = local_804;
  auVar30 = ZEXT416(local_804);
  local_b28 = CONCAT44(iVar27 >> auVar30,iVar25 >> auVar30);
  uStack_b20 = CONCAT44(iVar29 >> auVar30,iVar28 >> auVar30);
  local_668 = local_bd8._0_8_;
  uStack_660 = local_bd8._8_8_;
  local_678 = local_be8._0_8_;
  uStack_670 = local_be8._8_8_;
  local_af8 = CONCAT44(local_558._4_4_ + local_548._4_4_,(int)local_558 + (int)local_548);
  uStack_af0 = CONCAT44(uStack_550._4_4_ + uStack_540._4_4_,(int)uStack_550 + (int)uStack_540);
  local_688 = local_af8;
  uStack_680 = uStack_af0;
  local_698 = local_998;
  iStack_694 = iStack_994;
  iStack_690 = iStack_990;
  iStack_68c = iStack_98c;
  iVar25 = (int)local_558 + (int)local_548 + local_998;
  iVar27 = local_558._4_4_ + local_548._4_4_ + iStack_994;
  iVar28 = (int)uStack_550 + (int)uStack_540 + iStack_990;
  iVar29 = uStack_550._4_4_ + uStack_540._4_4_ + iStack_98c;
  local_af8 = CONCAT44(iVar27,iVar25);
  uStack_af0 = CONCAT44(iVar29,iVar28);
  local_7a8 = local_af8;
  uStack_7a0 = uStack_af0;
  local_7ac = local_804;
  auVar30 = ZEXT416(local_804);
  local_af8 = CONCAT44(iVar27 >> auVar30,iVar25 >> auVar30);
  uStack_af0 = CONCAT44(iVar29 >> auVar30,iVar28 >> auVar30);
  local_458 = local_a18;
  lStack_450 = lStack_a10;
  local_468 = local_948;
  uStack_460 = uStack_940;
  auVar2._8_8_ = lStack_a10;
  auVar2._0_8_ = local_a18;
  auVar1._8_8_ = uStack_940;
  auVar1._0_8_ = local_948;
  local_bd8 = pmulld(auVar2,auVar1);
  local_478 = local_a08;
  lStack_470 = lStack_a00;
  local_488 = local_948;
  uStack_480 = uStack_940;
  auVar26._8_8_ = lStack_a00;
  auVar26._0_8_ = local_a08;
  auVar30._8_8_ = uStack_940;
  auVar30._0_8_ = local_948;
  local_be8 = pmulld(auVar26,auVar30);
  local_568 = local_be8._0_8_;
  uVar17 = local_568;
  uStack_560 = local_be8._8_8_;
  uVar18 = uStack_560;
  local_578 = local_bd8._0_8_;
  uVar15 = local_578;
  uStack_570 = local_bd8._8_8_;
  uVar16 = uStack_570;
  local_568._0_4_ = local_be8._0_4_;
  local_568._4_4_ = local_be8._4_4_;
  uStack_560._0_4_ = local_be8._8_4_;
  uStack_560._4_4_ = local_be8._12_4_;
  local_578._0_4_ = local_bd8._0_4_;
  local_578._4_4_ = local_bd8._4_4_;
  uStack_570._0_4_ = local_bd8._8_4_;
  uStack_570._4_4_ = local_bd8._12_4_;
  local_b18 = CONCAT44(local_568._4_4_ - local_578._4_4_,(int)local_568 - (int)local_578);
  uStack_b10 = CONCAT44(uStack_560._4_4_ - uStack_570._4_4_,(int)uStack_560 - (int)uStack_570);
  local_6a8 = local_b18;
  uStack_6a0 = uStack_b10;
  local_6b8 = local_998;
  iStack_6b4 = iStack_994;
  iStack_6b0 = iStack_990;
  iStack_6ac = iStack_98c;
  iVar25 = ((int)local_568 - (int)local_578) + local_998;
  iVar27 = (local_568._4_4_ - local_578._4_4_) + iStack_994;
  iVar28 = ((int)uStack_560 - (int)uStack_570) + iStack_990;
  iVar29 = (uStack_560._4_4_ - uStack_570._4_4_) + iStack_98c;
  local_b18 = CONCAT44(iVar27,iVar25);
  uStack_b10 = CONCAT44(iVar29,iVar28);
  local_7c8 = local_b18;
  uStack_7c0 = uStack_b10;
  local_7cc = local_804;
  auVar30 = ZEXT416(local_804);
  local_b18 = CONCAT44(iVar27 >> auVar30,iVar25 >> auVar30);
  uStack_b10 = CONCAT44(iVar29 >> auVar30,iVar28 >> auVar30);
  local_6c8 = local_bd8._0_8_;
  uStack_6c0 = local_bd8._8_8_;
  local_6d8 = local_be8._0_8_;
  uStack_6d0 = local_be8._8_8_;
  local_b08 = CONCAT44(local_578._4_4_ + local_568._4_4_,(int)local_578 + (int)local_568);
  uStack_b00 = CONCAT44(uStack_570._4_4_ + uStack_560._4_4_,(int)uStack_570 + (int)uStack_560);
  local_6e8 = local_b08;
  uStack_6e0 = uStack_b00;
  local_6f8 = local_998;
  iStack_6f4 = iStack_994;
  iStack_6f0 = iStack_990;
  iStack_6ec = iStack_98c;
  iVar25 = (int)local_578 + (int)local_568 + local_998;
  iVar27 = local_578._4_4_ + local_568._4_4_ + iStack_994;
  iVar28 = (int)uStack_570 + (int)uStack_560 + iStack_990;
  iVar29 = uStack_570._4_4_ + uStack_560._4_4_ + iStack_98c;
  local_b08 = CONCAT44(iVar27,iVar25);
  uStack_b00 = CONCAT44(iVar29,iVar28);
  local_7e8 = local_b08;
  uStack_7e0 = uStack_b00;
  local_7ec = local_804;
  auVar30 = ZEXT416(local_804);
  local_b08 = CONCAT44(iVar27 >> auVar30,iVar25 >> auVar30);
  uStack_b00 = CONCAT44(iVar29 >> auVar30,iVar28 >> auVar30);
  local_ae8 = local_9e8;
  lStack_ae0 = lStack_9e0;
  local_ad8 = local_9d8;
  lStack_ad0 = lStack_9d0;
  in0_15[1] = local_800 + 0xf;
  in0_15[0] = (longlong)local_800;
  in1_15[1] = (longlong)&local_9c8;
  in1_15[0] = (longlong)&local_9b8;
  local_578 = uVar15;
  uStack_570 = uVar16;
  local_568 = uVar17;
  uStack_560 = uVar18;
  local_558 = uVar19;
  uStack_550 = uVar20;
  local_548 = uVar21;
  uStack_540 = uVar22;
  addsub_sse4_1(in0_15,in1_15,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_16[0] = local_800 + 1;
  in0_16[1] = local_800 + 0xe;
  in1_16[1] = (longlong)&local_9c8;
  in1_16[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_16,in1_16,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_17[0] = local_800 + 2;
  in0_17[1] = local_800 + 0xd;
  in1_17[1] = (longlong)&local_9c8;
  in1_17[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_17,in1_17,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_18[0] = local_800 + 3;
  in0_18[1] = local_800 + 0xc;
  in1_18[1] = (longlong)&local_9c8;
  in1_18[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_18,in1_18,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_19[0] = local_800 + 4;
  in0_19[1] = local_800 + 0xb;
  in1_19[1] = (longlong)&local_9c8;
  in1_19[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_19,in1_19,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_20[0] = local_800 + 5;
  in0_20[1] = local_800 + 10;
  in1_20[1] = (longlong)&local_9c8;
  in1_20[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_20,in1_20,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_21[0] = local_800 + 6;
  in0_21[1] = local_800 + 9;
  in1_21[1] = (longlong)&local_9c8;
  in1_21[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_21,in1_21,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  in0_22[0] = local_800 + 7;
  in0_22[1] = local_800 + 8;
  in1_22[1] = (longlong)&local_9c8;
  in1_22[0] = (longlong)&local_9b8;
  addsub_sse4_1(in0_22,in1_22,palVar23,palVar24,
                (__m128i *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8),
                (__m128i *)CONCAT44(iVar31,in_stack_fffffffffffff3e0));
  if (local_808 == 0) {
    if (local_80c + 6 < 0x10) {
      local_bec = 0x10;
    }
    else {
      local_bec = local_80c + 6;
    }
    local_4f4 = -(1 << ((char)local_bec - 1U & 0x1f));
    local_c08 = CONCAT44(local_4f4,local_4f4);
    lStack_c00 = CONCAT44(local_4f4,local_4f4);
    local_4f8 = (1 << ((char)local_bec - 1U & 0x1f)) + -1;
    local_c18 = CONCAT44(local_4f8,local_4f8);
    lStack_c10 = CONCAT44(local_4f8,local_4f8);
    local_48 = local_c08;
    lStack_40 = lStack_c00;
    local_38 = local_4f4;
    local_34 = local_4f4;
    local_30 = local_4f4;
    local_2c = local_4f4;
    local_28 = local_c18;
    lStack_20 = lStack_c10;
    local_10 = local_4f8;
    local_c = local_4f8;
    local_8 = local_4f8;
    local_4 = local_4f8;
    round_shift_8x8((__m128i *)CONCAT44(iVar31,local_bec),in_stack_fffffffffffff3dc);
    highbd_clamp_epi32_sse4_1(local_800,local_800,(__m128i *)&local_c08,(__m128i *)&local_c18,0x10);
  }
  return;
}

Assistant:

static void idct16x16_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[16], v[16], x, y;

  {
    // stage 0
    // stage 1
    u[0] = in[0];
    u[1] = in[8];
    u[2] = in[4];
    u[3] = in[12];
    u[4] = in[2];
    u[5] = in[10];
    u[6] = in[6];
    u[7] = in[14];
    u[8] = in[1];
    u[9] = in[9];
    u[10] = in[5];
    u[11] = in[13];
    u[12] = in[3];
    u[13] = in[11];
    u[14] = in[7];
    u[15] = in[15];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];

    v[8] = half_btf_sse4_1(&cospi60, &u[8], &cospim4, &u[15], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi28, &u[9], &cospim36, &u[14], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi44, &u[10], &cospim20, &u[13], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi12, &u[11], &cospim52, &u[12], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospi52, &u[11], &cospi12, &u[12], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi20, &u[10], &cospi44, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi36, &u[9], &cospi28, &u[14], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi4, &u[8], &cospi60, &u[15], &rnding, bit);

    // stage 3
    u[0] = v[0];
    u[1] = v[1];
    u[2] = v[2];
    u[3] = v[3];
    u[4] = half_btf_sse4_1(&cospi56, &v[4], &cospim8, &v[7], &rnding, bit);
    u[5] = half_btf_sse4_1(&cospi24, &v[5], &cospim40, &v[6], &rnding, bit);
    u[6] = half_btf_sse4_1(&cospi40, &v[5], &cospi24, &v[6], &rnding, bit);
    u[7] = half_btf_sse4_1(&cospi8, &v[4], &cospi56, &v[7], &rnding, bit);
    addsub_sse4_1(v[8], v[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[11], v[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[12], v[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[15], v[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

    // stage 4
    x = _mm_mullo_epi32(u[0], cospi32);
    y = _mm_mullo_epi32(u[1], cospi32);
    v[0] = _mm_add_epi32(x, y);
    v[0] = _mm_add_epi32(v[0], rnding);
    v[0] = _mm_srai_epi32(v[0], bit);

    v[1] = _mm_sub_epi32(x, y);
    v[1] = _mm_add_epi32(v[1], rnding);
    v[1] = _mm_srai_epi32(v[1], bit);

    v[2] = half_btf_sse4_1(&cospi48, &u[2], &cospim16, &u[3], &rnding, bit);
    v[3] = half_btf_sse4_1(&cospi16, &u[2], &cospi48, &u[3], &rnding, bit);
    addsub_sse4_1(u[4], u[5], &v[4], &v[5], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[7], u[6], &v[7], &v[6], &clamp_lo, &clamp_hi);
    v[8] = u[8];
    v[9] = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    v[11] = u[11];
    v[12] = u[12];
    v[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    v[15] = u[15];

    // stage 5
    addsub_sse4_1(v[0], v[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[1], v[2], &u[1], &u[2], &clamp_lo, &clamp_hi);
    u[4] = v[4];

    x = _mm_mullo_epi32(v[5], cospi32);
    y = _mm_mullo_epi32(v[6], cospi32);
    u[5] = _mm_sub_epi32(y, x);
    u[5] = _mm_add_epi32(u[5], rnding);
    u[5] = _mm_srai_epi32(u[5], bit);

    u[6] = _mm_add_epi32(y, x);
    u[6] = _mm_add_epi32(u[6], rnding);
    u[6] = _mm_srai_epi32(u[6], bit);

    u[7] = v[7];
    addsub_sse4_1(v[8], v[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[9], v[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[15], v[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[14], v[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    // stage 6
    addsub_sse4_1(u[0], u[7], &v[0], &v[7], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[1], u[6], &v[1], &v[6], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[2], u[5], &v[2], &v[5], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[3], u[4], &v[3], &v[4], &clamp_lo, &clamp_hi);
    v[8] = u[8];
    v[9] = u[9];

    x = _mm_mullo_epi32(u[10], cospi32);
    y = _mm_mullo_epi32(u[13], cospi32);
    v[10] = _mm_sub_epi32(y, x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_add_epi32(x, y);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    x = _mm_mullo_epi32(u[11], cospi32);
    y = _mm_mullo_epi32(u[12], cospi32);
    v[11] = _mm_sub_epi32(y, x);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = _mm_add_epi32(x, y);
    v[12] = _mm_add_epi32(v[12], rnding);
    v[12] = _mm_srai_epi32(v[12], bit);

    v[14] = u[14];
    v[15] = u[15];

    // stage 7
    addsub_sse4_1(v[0], v[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[1], v[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[2], v[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[3], v[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[4], v[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[5], v[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[6], v[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[7], v[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
      const __m128i clamp_hi_out =
          _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
      round_shift_8x8(out, out_shift);
      highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
    }
  }
}